

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_data_collection.cpp
# Opt level: O3

void __thiscall duckdb::RowDataCollection::Merge(RowDataCollection *this,RowDataCollection *other)

{
  BufferManager *buffer_manager;
  pointer puVar1;
  pointer pBVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  pointer puVar7;
  pointer pBVar8;
  vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> *pvVar9;
  int iVar10;
  undefined4 extraout_var;
  unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true> *block;
  pointer puVar11;
  pointer pBVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  RowDataCollection RStack_c8;
  vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_> local_48;
  
  if (other->count != 0) {
    buffer_manager = this->buffer_manager;
    iVar10 = (*buffer_manager->_vptr_BufferManager[0xf])(buffer_manager);
    RowDataCollection(&RStack_c8,buffer_manager,CONCAT44(extraout_var,iVar10),1,false);
    iVar10 = pthread_mutex_lock((pthread_mutex_t *)&other->rdc_lock);
    if (iVar10 != 0) {
      ::std::__throw_system_error(iVar10);
    }
    RStack_c8.count = other->count;
    RStack_c8.block_capacity = other->block_capacity;
    RStack_c8.entry_size = other->entry_size;
    puVar11 = (other->blocks).
              super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (other->blocks).
             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar1 = (other->blocks).
             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)RStack_c8.blocks.
                  super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (pointer)RStack_c8.blocks.
                  super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (pointer)RStack_c8.blocks.
                  super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (other->blocks).
    super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (other->blocks).
    super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (other->blocks).
    super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    RStack_c8.blocks.
    super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar11;
    RStack_c8.blocks.
    super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar7;
    RStack_c8.blocks.
    super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar1;
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
               *)&local_48);
    pBVar12 = (other->pinned_blocks).
              super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
              super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pBVar8 = (other->pinned_blocks).
             super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
             super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pBVar2 = (other->pinned_blocks).
             super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
             super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_start =
         RStack_c8.pinned_blocks.
         super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
         super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_finish =
         RStack_c8.pinned_blocks.
         super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
         super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         RStack_c8.pinned_blocks.
         super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
         super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (other->pinned_blocks).super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
    .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar9 = &(other->pinned_blocks).
              super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>;
    (pvVar9->super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar9->super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    RStack_c8.pinned_blocks.
    super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
    super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
    super__Vector_impl_data._M_start = pBVar12;
    RStack_c8.pinned_blocks.
    super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
    super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = pBVar8;
    RStack_c8.pinned_blocks.
    super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
    super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pBVar2;
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector(&local_48);
    pthread_mutex_unlock((pthread_mutex_t *)&other->rdc_lock);
    Clear(other);
    iVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->rdc_lock);
    puVar1 = RStack_c8.blocks.
             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar10 != 0) {
      ::std::__throw_system_error(iVar10);
    }
    this->count = this->count + RStack_c8.count;
    uVar3 = (uint)this->block_capacity;
    uVar4 = *(uint *)((long)&this->block_capacity + 4);
    uVar5 = (uint)this->entry_size;
    uVar6 = *(uint *)((long)&this->entry_size + 4);
    uVar13 = uVar4 ^ 0x80000000;
    uVar14 = uVar6 ^ 0x80000000;
    uVar16 = -(uint)((int)((uint)RStack_c8.block_capacity ^ 0x80000000) < (int)(uVar3 ^ 0x80000000))
    ;
    uVar17 = -(uint)((int)(RStack_c8.block_capacity._4_4_ ^ 0x80000000) < (int)uVar13);
    uVar18 = -(uint)((int)((uint)RStack_c8.entry_size ^ 0x80000000) < (int)(uVar5 ^ 0x80000000));
    uVar19 = -(uint)((int)(RStack_c8.entry_size._4_4_ ^ 0x80000000) < (int)uVar14);
    uVar13 = -(uint)((RStack_c8.block_capacity._4_4_ ^ 0x80000000) == uVar13);
    uVar14 = -(uint)((RStack_c8.entry_size._4_4_ ^ 0x80000000) == uVar14);
    uVar15 = uVar17 | uVar13 & uVar16;
    uVar17 = uVar17 | uVar13 & uVar16;
    uVar13 = uVar19 | uVar14 & uVar18;
    uVar19 = uVar19 | uVar14 & uVar18;
    *(uint *)&this->block_capacity = ~uVar15 & (uint)RStack_c8.block_capacity | uVar3 & uVar15;
    *(uint *)((long)&this->block_capacity + 4) =
         ~uVar17 & RStack_c8.block_capacity._4_4_ | uVar4 & uVar17;
    *(uint *)&this->entry_size = ~uVar13 & (uint)RStack_c8.entry_size | uVar5 & uVar13;
    *(uint *)((long)&this->entry_size + 4) = ~uVar19 & RStack_c8.entry_size._4_4_ | uVar6 & uVar19;
    if (RStack_c8.blocks.
        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        RStack_c8.blocks.
        super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      puVar11 = RStack_c8.blocks.
                super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        ::std::
        vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                    *)&this->blocks,puVar11);
        puVar11 = puVar11 + 1;
      } while (puVar11 != puVar1);
    }
    pBVar2 = RStack_c8.pinned_blocks.
             super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
             super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (RStack_c8.pinned_blocks.
        super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
        super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
        super__Vector_impl_data._M_start !=
        RStack_c8.pinned_blocks.
        super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
        super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pBVar12 = RStack_c8.pinned_blocks.
                super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
                super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::
        emplace_back<duckdb::BufferHandle>
                  (&(this->pinned_blocks).
                    super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>,
                   pBVar12);
        pBVar12 = pBVar12 + 1;
      } while (pBVar12 != pBVar2);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->rdc_lock);
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
              (&RStack_c8.pinned_blocks.
                super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>);
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
    ::~vector(&RStack_c8.blocks.
               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             );
  }
  return;
}

Assistant:

void RowDataCollection::Merge(RowDataCollection &other) {
	if (other.count == 0) {
		return;
	}
	RowDataCollection temp(buffer_manager, buffer_manager.GetBlockSize(), 1);
	{
		//	One lock at a time to avoid deadlocks
		lock_guard<mutex> read_lock(other.rdc_lock);
		temp.count = other.count;
		temp.block_capacity = other.block_capacity;
		temp.entry_size = other.entry_size;
		temp.blocks = std::move(other.blocks);
		temp.pinned_blocks = std::move(other.pinned_blocks);
	}
	other.Clear();

	lock_guard<mutex> write_lock(rdc_lock);
	count += temp.count;
	block_capacity = MaxValue(block_capacity, temp.block_capacity);
	entry_size = MaxValue(entry_size, temp.entry_size);
	for (auto &block : temp.blocks) {
		blocks.emplace_back(std::move(block));
	}
	for (auto &handle : temp.pinned_blocks) {
		pinned_blocks.emplace_back(std::move(handle));
	}
}